

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O1

void tcg_gen_smax_i64_s390x(TCGContext_conflict12 *tcg_ctx,TCGv_i64 ret,TCGv_i64 a,TCGv_i64 b)

{
  TCGOp *pTVar1;
  uintptr_t o_2;
  uintptr_t o_1;
  uintptr_t o;
  
  pTVar1 = tcg_emit_op_s390x(tcg_ctx,INDEX_op_movcond_i64);
  pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
  pTVar1->args[1] = (TCGArg)(a + (long)tcg_ctx);
  pTVar1->args[2] = (TCGArg)(b + (long)tcg_ctx);
  pTVar1->args[3] = (TCGArg)(b + (long)tcg_ctx);
  pTVar1->args[4] = (TCGArg)(a + (long)tcg_ctx);
  pTVar1->args[5] = 2;
  return;
}

Assistant:

void tcg_gen_smax_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 a, TCGv_i64 b)
{
    tcg_gen_movcond_i64(tcg_ctx, TCG_COND_LT, ret, a, b, b, a);
}